

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

int TPZFMatrix<double>::Substitution(double *ptr,int64_t rows,TPZFMatrix<double> *B)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  bool bVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  char *msg1;
  long lVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  double dVar13;
  ulong local_80;
  
  lVar1 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  uVar2 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar1 != rows) {
    Error("static::SubstitutionLU <incompatible dimensions>",(char *)0x0);
  }
  if (0 < lVar1) {
    lVar5 = 0;
    pdVar11 = ptr;
    do {
      if (0 < (long)uVar2) {
        uVar8 = 0;
        do {
          if (lVar5 != 0) {
            pdVar3 = B->fElem;
            lVar9 = (uVar8 & 0xffffffff) * lVar1;
            dVar13 = pdVar3[lVar9 + lVar5];
            lVar10 = 0;
            pdVar6 = pdVar11;
            do {
              dVar13 = dVar13 - *pdVar6 * *(double *)
                                           ((long)pdVar3 +
                                           lVar10 * 8 + (uVar8 & 0xffffffff) * lVar1 * 8);
              pdVar3[lVar9 + lVar5] = dVar13;
              lVar10 = lVar10 + 1;
              pdVar6 = pdVar6 + rows;
            } while (lVar5 != lVar10);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar2);
      }
      lVar5 = lVar5 + 1;
      pdVar11 = pdVar11 + 1;
    } while (lVar5 != lVar1);
  }
  if (0 < (long)uVar2) {
    local_80 = 0;
    do {
      if (0 < lVar1) {
        lVar9 = (local_80 & 0xffffffff) * lVar1;
        lVar10 = 0;
        pdVar11 = (double *)((long)ptr + (rows * 8 + 8) * lVar1 + -8);
        lVar5 = lVar1;
        do {
          lVar12 = lVar5 + -1;
          if (lVar5 < lVar1) {
            pdVar3 = B->fElem;
            dVar13 = pdVar3[lVar9 + lVar12];
            pdVar6 = pdVar11;
            lVar7 = lVar10;
            do {
              dVar13 = dVar13 - *pdVar6 * *(double *)
                                           ((long)pdVar3 +
                                           lVar7 * 8 + ((local_80 & 0xffffffff) * 8 + 8) * lVar1);
              pdVar3[lVar9 + lVar12] = dVar13;
              pdVar6 = pdVar6 + rows;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 0);
          }
          lVar7 = lVar12 * (rows + 1);
          dVar13 = ptr[lVar7];
          if ((ABS(dVar13) < 1e-12) &&
             ((msg1 = "static::BackSub(SubstitutionLU) <Matrix is singular", dVar13 == 0.0 ||
              (msg1 = "static::BackSub(SubstitutionLU) <Matrix is singular even after Power Plus..."
              , 1e-12 < ABS(B->fElem[lVar9 + lVar12] - dVar13))))) {
            Error(msg1,(char *)0x0);
          }
          B->fElem[lVar9 + lVar12] = B->fElem[lVar9 + lVar12] / ptr[lVar7];
          lVar10 = lVar10 + -1;
          pdVar11 = (double *)((long)pdVar11 + (rows * 8 ^ 0xfffffffffffffff8U));
          bVar4 = 1 < lVar5;
          lVar5 = lVar12;
        } while (bVar4);
      }
      local_80 = local_80 + 1;
    } while (local_80 != uVar2);
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Substitution(const TVar *ptr, int64_t rows, TPZFMatrix<TVar> *B)
{
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    if ( rowb != rows ) Error( "static::SubstitutionLU <incompatible dimensions>" );
    int64_t i,j;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ )
            for (j = 0; j < i; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - SELECTEL(ptr, rows, i, j) * GETVAL(B, rowb, j, col));
    }
    
    for (int64_t col=0; col<colb; col++){
        for ( i = rowb-1; i >= 0; i-- ) {
            for (j = i+1; j < rowb ; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - SELECTEL(ptr, rows, i, j) * GETVAL(B, rowb, j, col));
            if ( IsZero( SELECTEL(ptr, rows, i, i)/*GetVal(i, i)*/ ) ) {
                if (fabs(SELECTEL(ptr, rows, i, i)/*GetVal(i, i)*/) > fabs((TVar)0.)) {
                    TVar tmp = GETVAL(B, rowb, i, col) - SELECTEL(ptr, rows, i, i);/*B->GetVal(i, col) - GetVal(i, i)*/
                    if (fabs(tmp) > fabs(((TVar)1e-12))) {
                        Error( "static::BackSub(SubstitutionLU) <Matrix is singular even after Power Plus..." );
                    }
                }else  Error( "static::BackSub(SubstitutionLU) <Matrix is singular" );
            }
            PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col)/SELECTEL(ptr, rows, i, i));
            //B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
        }
    }
    return( 1 );
}